

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::PipelineFromIncompleteCacheTest::createInstance
          (PipelineFromIncompleteCacheTest *this,Context *context)

{
  VkResult result;
  int iVar1;
  GraphicsCacheTestInstance *this_00;
  DeviceInterface *vk;
  VkDevice device;
  DeviceInterface *pDVar2;
  TestError *this_01;
  pointer_____offset_0x10___ *ppuVar3;
  size_t dataSize;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_98;
  RefBase<vk::Handle<(vk::HandleType)15>_> local_78;
  VkPipelineCacheCreateInfo pipelineCacheCreateInfo;
  
  this_00 = (GraphicsCacheTestInstance *)operator_new(0x598);
  GraphicsCacheTestInstance::GraphicsCacheTestInstance
            (this_00,context,&(this->super_GraphicsCacheTest).super_CacheTest.m_param);
  (this_00->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__PipelineFromIncompleteCacheTestInstance_00bfa4e0;
  this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
  this_00[1].super_CacheTestInstance.super_TestInstance.m_context = (Context *)0x0;
  this_00[1].super_CacheTestInstance.m_param = (CacheTestParam *)0x0;
  this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .object.m_internal = 0;
  this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
  .deleter.m_deviceIface = (DeviceInterface *)0x0;
  vk = Context::getDeviceInterface((this_00->super_CacheTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this_00->super_CacheTestInstance).super_TestInstance.m_context);
  dataSize = 0;
  result = (*vk->_vptr_DeviceInterface[0x2e])
                     (vk,device,
                      (this_00->super_CacheTestInstance).m_cache.
                      super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                      &dataSize,0);
  ::vk::checkResult(result,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x60c);
  if (dataSize == 0) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_01,"Empty pipeline cache - unable to test",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
               ,0x60f);
    ppuVar3 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    dataSize = dataSize - 1;
    pDVar2 = (DeviceInterface *)operator_new__(dataSize);
    this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
    m_data.deleter.m_deviceIface = pDVar2;
    iVar1 = (*vk->_vptr_DeviceInterface[0x2e])
                      (vk,device,
                       (this_00->super_CacheTestInstance).m_cache.
                       super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal,
                       &dataSize);
    if (iVar1 == 5) {
      pipelineCacheCreateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;
      pipelineCacheCreateInfo.pNext = (void *)0x0;
      pipelineCacheCreateInfo._16_8_ = (ulong)(uint)pipelineCacheCreateInfo._20_4_ << 0x20;
      pipelineCacheCreateInfo.initialDataSize = dataSize;
      pipelineCacheCreateInfo.pInitialData =
           this_00[1].super_CacheTestInstance.m_cmdPool.
           super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
      ::vk::createPipelineCache
                ((Move<vk::Handle<(vk::HandleType)15>_> *)&local_78,vk,device,
                 &pipelineCacheCreateInfo,(VkAllocationCallbacks *)0x0);
      local_98.m_data.deleter.m_device = local_78.m_data.deleter.m_device;
      local_98.m_data.deleter.m_allocator = local_78.m_data.deleter.m_allocator;
      local_98.m_data.object.m_internal = local_78.m_data.object.m_internal;
      local_98.m_data.deleter.m_deviceIface = local_78.m_data.deleter.m_deviceIface;
      local_78.m_data.object.m_internal = 0;
      local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
      local_78.m_data.deleter.m_device = (VkDevice)0x0;
      local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::reset
                ((RefBase<vk::Handle<(vk::HandleType)15>_> *)(this_00 + 1));
      this_00[1].super_CacheTestInstance.m_param =
           (CacheTestParam *)local_98.m_data.deleter.m_device;
      this_00[1].super_CacheTestInstance.m_cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
      m_data.object.m_internal = (deUint64)local_98.m_data.deleter.m_allocator;
      this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance =
           (_func_int **)local_98.m_data.object.m_internal;
      this_00[1].super_CacheTestInstance.super_TestInstance.m_context =
           (Context *)local_98.m_data.deleter.m_deviceIface;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::~RefBase(&local_78);
      tcu::Vector<unsigned_int,_2>::Vector
                ((Vector<unsigned_int,_2> *)&local_78,&this_00->m_renderSize);
      SimpleGraphicsPipelineBuilder::buildPipeline
                ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_98,
                 (SimpleGraphicsPipelineBuilder *)&this_00->m_pipelineBuilder,(UVec2 *)&local_78,
                 (VkRenderPass)
                 (this_00->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                 object.m_internal,
                 (VkPipelineCache)
                 this_00[1].super_CacheTestInstance.super_TestInstance._vptr_TestInstance,
                 (VkPipelineLayout)
                 (this_00->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                 object.m_internal);
      pipelineCacheCreateInfo._16_8_ = local_98.m_data.deleter.m_device;
      pipelineCacheCreateInfo.initialDataSize = (deUintptr)local_98.m_data.deleter.m_allocator;
      pipelineCacheCreateInfo._0_8_ = local_98.m_data.object.m_internal;
      pipelineCacheCreateInfo.pNext = local_98.m_data.deleter.m_deviceIface;
      local_98.m_data.object.m_internal = 0;
      local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
      local_98.m_data.deleter.m_device = (VkDevice)0x0;
      local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
                (&this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>);
      this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device
           = (VkDevice)pipelineCacheCreateInfo._16_8_;
      this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)pipelineCacheCreateInfo.initialDataSize;
      this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
           = pipelineCacheCreateInfo._0_8_;
      this_00->m_pipeline[1].super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)pipelineCacheCreateInfo.pNext;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_98);
      return (TestInstance *)this_00;
    }
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"GetPipelineCacheData should return VK_INCOMPLETE state!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
               ,0x616);
    ppuVar3 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_01,ppuVar3,tcu::Exception::~Exception);
}

Assistant:

TestInstance* PipelineFromIncompleteCacheTest::createInstance (Context& context) const
{
	return new PipelineFromIncompleteCacheTestInstance(context, &m_param);
}